

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nearest_neighbor.cc
# Opt level: O3

void __thiscall
features::NearestNeighbor<short>::find(NearestNeighbor<short> *this,short *query,Result *result)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  short *psVar6;
  int iVar7;
  short *psVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  
  result->index_2nd_best = 0;
  result->dist_1st_best = 0;
  result->dist_2nd_best = 0;
  result->index_1st_best = 0;
  iVar1 = *(int *)this;
  iVar2 = *(int *)(this + 4);
  iVar5 = iVar1 + 7;
  if (-1 < iVar1) {
    iVar5 = iVar1;
  }
  if (iVar2 < 1) {
    sVar12 = 0;
    sVar13 = 0;
  }
  else {
    psVar6 = *(short **)(this + 8);
    iVar3 = 0;
    iVar4 = 0;
    iVar7 = 0;
    iVar9 = 0;
    do {
      sVar12 = 0;
      sVar13 = 0;
      sVar14 = 0;
      sVar15 = 0;
      sVar16 = 0;
      sVar17 = 0;
      sVar18 = 0;
      sVar19 = 0;
      psVar8 = query;
      iVar10 = iVar5 >> 3;
      if (7 < iVar1) {
        do {
          sVar12 = sVar12 + *psVar6 * *psVar8;
          sVar13 = sVar13 + psVar6[1] * psVar8[1];
          sVar14 = sVar14 + psVar6[2] * psVar8[2];
          sVar15 = sVar15 + psVar6[3] * psVar8[3];
          sVar16 = sVar16 + psVar6[4] * psVar8[4];
          sVar17 = sVar17 + psVar6[5] * psVar8[5];
          sVar18 = sVar18 + psVar6[6] * psVar8[6];
          sVar19 = sVar19 + psVar6[7] * psVar8[7];
          psVar6 = psVar6 + 8;
          iVar10 = iVar10 + -1;
          psVar8 = psVar8 + 8;
        } while (iVar10 != 0);
      }
      iVar11 = (int)sVar19 +
               (int)sVar18 + (int)sVar17 + (int)sVar16 +
               (int)sVar15 + (int)sVar14 + (int)sVar13 + (int)sVar12;
      iVar10 = iVar9;
      if ((short)iVar4 <= iVar11) {
        if (iVar11 < (short)iVar9) {
          result->index_2nd_best = iVar7;
          result->dist_2nd_best = (short)iVar11;
          iVar4 = iVar11;
        }
        else {
          result->index_2nd_best = iVar3;
          result->dist_2nd_best = (short)iVar9;
          result->index_1st_best = iVar7;
          result->dist_1st_best = (short)iVar11;
          iVar10 = iVar11;
          iVar3 = iVar7;
          iVar4 = iVar9;
        }
      }
      sVar12 = (short)iVar4;
      sVar13 = (short)iVar10;
      iVar7 = iVar7 + 1;
      iVar9 = iVar10;
    } while (iVar7 != iVar2);
  }
  sVar14 = 0;
  if (0 < sVar13) {
    sVar14 = sVar13;
  }
  if (0x3f00 < sVar14) {
    sVar14 = 0x3f01;
  }
  if (sVar12 < 1) {
    sVar12 = 0;
  }
  if (0x3f00 < sVar12) {
    sVar12 = 0x3f01;
  }
  result->dist_1st_best = sVar14 * -2 + 0x7e02;
  result->dist_2nd_best = sVar12 * -2 + 0x7e02;
  return;
}

Assistant:

void
NearestNeighbor<short>::find (short const* query,
    NearestNeighbor<short>::Result* result) const
{
    /* Result distances are shamelessly misused to store inner products. */
    result->dist_1st_best = 0;
    result->dist_2nd_best = 0;
    result->index_1st_best = 0;
    result->index_2nd_best = 0;

    short_inner_prod<short>(query, result, this->elements,
        this->num_elements, this->dimensions);

    /*
     * Compute actual square distances.
     * The distance with 'signed char' vectors is: 2 * 127^2 - 2 * <Q, Ci>.
     * The maximum distance is (2*127)^2, which unfortunately does not fit
     * in a signed short. Therefore, the distance is clapmed at 127^2.
     */
    result->dist_1st_best = std::min(16129, std::max(0, (int)result->dist_1st_best));
    result->dist_2nd_best = std::min(16129, std::max(0, (int)result->dist_2nd_best));
    result->dist_1st_best = 32258 - 2 * result->dist_1st_best;
    result->dist_2nd_best = 32258 - 2 * result->dist_2nd_best;
}